

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

bool lest::is_number(text *arg)

{
  long lVar1;
  bool bVar2;
  text digits;
  allocator<char> local_39;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,"0123456789",&local_39);
  bVar2 = false;
  lVar1 = std::__cxx11::string::find_first_of((string *)arg,(ulong)local_38);
  if (lVar1 != -1) {
    lVar1 = std::__cxx11::string::find_first_not_of((string *)arg,(ulong)local_38);
    bVar2 = lVar1 == -1;
  }
  std::__cxx11::string::~string(local_38);
  return bVar2;
}

Assistant:

inline bool is_number( text arg )
{
    const text digits = "0123456789";
    return text::npos != arg.find_first_of    ( digits )
        && text::npos == arg.find_first_not_of( digits );
}